

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tail_call_analysis.cpp
# Opt level: O0

void skiwi::tail_call_analysis(Expression *e)

{
  undefined1 local_60 [8];
  tail_call_analysis_helper tcah;
  value_type local_38;
  undefined1 local_30 [8];
  tail_calls_set_helper tcsh;
  Expression *e_local;
  
  tcsh._24_8_ = e;
  anon_unknown_23::tail_calls_set_helper::tail_calls_set_helper
            ((tail_calls_set_helper *)local_30,false);
  local_38 = (value_type)tcsh._24_8_;
  std::
  vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*>_>
  ::push_back((vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*>_>
               *)local_30,&local_38);
  anon_unknown_23::tail_calls_set_helper::treat_expressions((tail_calls_set_helper *)local_30);
  anon_unknown_23::tail_call_analysis_helper::tail_call_analysis_helper
            ((tail_call_analysis_helper *)local_60);
  anon_unknown_23::tail_call_analysis_helper::add_expression
            ((tail_call_analysis_helper *)local_60,(Expression *)tcsh._24_8_);
  anon_unknown_23::tail_call_analysis_helper::treat_expressions
            ((tail_call_analysis_helper *)local_60);
  anon_unknown_23::tail_call_analysis_helper::~tail_call_analysis_helper
            ((tail_call_analysis_helper *)local_60);
  anon_unknown_23::tail_calls_set_helper::~tail_calls_set_helper((tail_calls_set_helper *)local_30);
  return;
}

Assistant:

void tail_call_analysis(Expression& e)
  {
  tail_calls_set_helper tcsh(false);
  tcsh.expressions.push_back(&e);
  tcsh.treat_expressions();

  tail_call_analysis_helper tcah;
  tcah.add_expression(e);
  tcah.treat_expressions();
  }